

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleComboBox::focusChild(QAccessibleComboBox *this)

{
  bool bVar1;
  QComboBox *pQVar2;
  QComboBox *in_RDI;
  QComboBox *cBox;
  QAccessibleInterface *local_8;
  
  pQVar2 = comboBox((QAccessibleComboBox *)0x7d50dc);
  if ((pQVar2 == (QComboBox *)0x0) || (bVar1 = QComboBox::isEditable(in_RDI), !bVar1)) {
    local_8 = (QAccessibleInterface *)0x0;
  }
  else {
    local_8 = (QAccessibleInterface *)
              (**(code **)(*(long *)&in_RDI->super_QWidget + 0x48))(in_RDI,1);
  }
  return local_8;
}

Assistant:

QAccessibleInterface *QAccessibleComboBox::focusChild() const
{
    // The editable combobox is the focus proxy of its lineedit, so the
    // lineedit itself never gets focus. But it is the accessible focus
    // child of an editable combobox.
    if (QComboBox *cBox = comboBox()) {
        if (cBox->isEditable())
            return child(1);
    }
    return nullptr;
}